

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

ParseNodePtr __thiscall Parser::ParseImportCall<true>(Parser *this)

{
  Scanner_t *pSVar1;
  ParseNodePtr pnode2;
  ParseNodeType *pnode1;
  ParseNodeCall *pPVar2;
  ParseNodePtr specifier;
  Parser *this_local;
  
  pSVar1 = GetScanner(this);
  Scanner<UTF8EncodingPolicyBase<false>_>::Scan(pSVar1);
  pnode2 = ParseExpr<true>(this,1,(BOOL *)0x0,0,0,(LPCOLESTR)0x0,(uint32 *)0x0,(uint32 *)0x0,
                           (IdentToken *)0x0,false,(bool *)0x0,(charcount_t *)0x0,(bool *)0x0);
  if ((this->m_token).tk != tkRParen) {
    Error(this,-0x7ff5fc12,L"",L"");
  }
  pSVar1 = GetScanner(this);
  Scanner<UTF8EncodingPolicyBase<false>_>::Scan(pSVar1);
  pnode1 = CreateNodeForOpT<(OpCode)4>(this);
  pPVar2 = CreateCallNode(this,knopCall,pnode1,pnode2);
  return &pPVar2->super_ParseNode;
}

Assistant:

ParseNodePtr Parser::ParseImportCall()
{
    this->GetScanner()->Scan();
    ParseNodePtr specifier = ParseExpr<buildAST>(koplCma, nullptr, /* fAllowIn */FALSE, /* fAllowEllipsis */FALSE);
    if (m_token.tk != tkRParen)
    {
        Error(ERRnoRparen);
    }

    this->GetScanner()->Scan();
    return buildAST ? CreateCallNode(knopCall, CreateNodeForOpT<knopImport>(), specifier) : nullptr;
}